

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::allocate(xpath_allocator *this,size_t size)

{
  xpath_memory_block *pxVar1;
  anon_union_4096_2_e9978466_for_xpath_memory_block_2 *paVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = size + 7 & 0xfffffffffffffff8;
  uVar4 = this->_root_size + uVar3;
  if (this->_root->capacity < uVar4) {
    uVar4 = 0x1000;
    if (0x1000 < uVar3 + 0x400) {
      uVar4 = uVar3 + 0x400;
    }
    pxVar1 = (xpath_memory_block *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (uVar4 + 0x10);
    if (pxVar1 == (xpath_memory_block *)0x0) {
      if (this->_error != (bool *)0x0) {
        *this->_error = true;
      }
      paVar2 = (anon_union_4096_2_e9978466_for_xpath_memory_block_2 *)0x0;
    }
    else {
      pxVar1->next = this->_root;
      pxVar1->capacity = uVar4;
      this->_root = pxVar1;
      this->_root_size = uVar3;
      paVar2 = &pxVar1->field_2;
    }
  }
  else {
    paVar2 = (anon_union_4096_2_e9978466_for_xpath_memory_block_2 *)
             ((long)&this->_root->field_2 + this->_root_size);
    this->_root_size = uVar4;
  }
  return paVar2;
}

Assistant:

void* allocate(size_t size)
		{
			// round size up to block alignment boundary
			size = (size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			if (_root_size + size <= _root->capacity)
			{
				void* buf = &_root->data[0] + _root_size;
				_root_size += size;
				return buf;
			}
			else
			{
				// make sure we have at least 1/4th of the page free after allocation to satisfy subsequent allocation requests
				size_t block_capacity_base = sizeof(_root->data);
				size_t block_capacity_req = size + block_capacity_base / 4;
				size_t block_capacity = (block_capacity_base > block_capacity_req) ? block_capacity_base : block_capacity_req;

				size_t block_size = block_capacity + offsetof(xpath_memory_block, data);

				xpath_memory_block* block = static_cast<xpath_memory_block*>(xml_memory::allocate(block_size));
				if (!block)
				{
					if (_error) *_error = true;
					return NULL;
				}

				block->next = _root;
				block->capacity = block_capacity;

				_root = block;
				_root_size = size;

				return block->data;
			}
		}